

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O3

void __thiscall
duckdb::JoinHashTable::ScanStructure::NextInnerJoin
          (ScanStructure *this,DataChunk *keys,DataChunk *left,DataChunk *result)

{
  SelectionVector *result_vector;
  buffer_ptr<SelectionData> *other;
  buffer_ptr<SelectionData> *this_00;
  data_ptr_t pdVar1;
  vector<unsigned_long,_true> *pvVar2;
  bool bVar3;
  idx_t count_p;
  reference pvVar4;
  const_reference pvVar5;
  ulong uVar6;
  ulong uVar7;
  size_type sVar8;
  ulong base_count;
  
  if (this->count != 0) {
    result_vector = &this->chain_match_sel_vector;
    other = &(this->last_sel_vector).selection_data;
    this_00 = &(this->chain_match_sel_vector).selection_data;
    base_count = 0;
    do {
      if (this->last_match_count == 0) {
        count_p = ScanInnerJoin(this,keys,result_vector);
      }
      else {
        shared_ptr<duckdb::SelectionData,_true>::operator=(this_00,other);
        count_p = this->last_match_count;
        (this->chain_match_sel_vector).sel_vector = (this->last_sel_vector).sel_vector;
        this->last_match_count = 0;
      }
      if (count_p != 0) {
        if (0x800 < count_p + base_count) {
          shared_ptr<duckdb::SelectionData,_true>::operator=(other,this_00);
          (this->last_sel_vector).sel_vector = (this->chain_match_sel_vector).sel_vector;
          this->last_match_count = count_p;
          break;
        }
        bVar3 = PropagatesBuildSide(this->ht->join_type);
        if (bVar3) {
          pdVar1 = (this->pointers).data;
          uVar6 = 0;
          do {
            uVar7 = uVar6;
            if (result_vector->sel_vector != (sel_t *)0x0) {
              uVar7 = (ulong)result_vector->sel_vector[uVar6];
            }
            *(undefined1 *)(*(long *)(pdVar1 + uVar7 * 8) + this->ht->tuple_size) = 1;
            uVar6 = uVar6 + 1;
          } while (count_p != uVar6);
        }
        if (1 < (byte)(this->ht->join_type - RIGHT_SEMI)) {
          if (this->ht->chains_longer_than_one == false) {
            DataChunk::Slice(result,left,result_vector,count_p,0);
            pvVar2 = this->ht->output_columns;
            if ((pvVar2->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (pvVar2->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start) {
              sVar8 = 0;
              do {
                pvVar4 = vector<duckdb::Vector,_true>::operator[]
                                   (&result->data,
                                    ((long)(left->data).
                                           super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                           .
                                           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(left->data).
                                           super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                           .
                                           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                    0x4ec4ec4ec4ec4ec5 + sVar8);
                pvVar5 = vector<unsigned_long,_true>::operator[](this->ht->output_columns,sVar8);
                GatherResult(this,pvVar4,result_vector,count_p,*pvVar5);
                sVar8 = sVar8 + 1;
                pvVar2 = this->ht->output_columns;
              } while (sVar8 < (ulong)((long)(pvVar2->
                                             super_vector<unsigned_long,_std::allocator<unsigned_long>_>
                                             ).
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(pvVar2->
                                             super_vector<unsigned_long,_std::allocator<unsigned_long>_>
                                             ).
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 3));
            }
            AdvancePointers(this,&this->sel_vector,this->count);
            return;
          }
          UpdateCompactionBuffer(this,base_count,result_vector,count_p);
          base_count = count_p + base_count;
        }
      }
      AdvancePointers(this,&this->sel_vector,this->count);
    } while (this->count != 0);
    if ((base_count != 0) &&
       (DataChunk::Slice(result,left,&this->lhs_sel_vector,base_count,0),
       pvVar2 = this->ht->output_columns,
       (pvVar2->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish !=
       (pvVar2->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start)) {
      sVar8 = 0;
      do {
        pvVar4 = vector<duckdb::Vector,_true>::operator[]
                           (&result->data,
                            ((long)(left->data).
                                   super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(left->data).
                                   super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x4ec4ec4ec4ec4ec5 + sVar8);
        pvVar5 = vector<unsigned_long,_true>::operator[](this->ht->output_columns,sVar8);
        GatherResult(this,pvVar4,base_count,*pvVar5);
        sVar8 = sVar8 + 1;
        pvVar2 = this->ht->output_columns;
      } while (sVar8 < (ulong)((long)(pvVar2->
                                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pvVar2->
                                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  return;
}

Assistant:

void ScanStructure::NextInnerJoin(DataChunk &keys, DataChunk &left, DataChunk &result) {
	if (ht.join_type != JoinType::RIGHT_SEMI && ht.join_type != JoinType::RIGHT_ANTI) {
		D_ASSERT(result.ColumnCount() == left.ColumnCount() + ht.output_columns.size());
	}

	idx_t base_count = 0;
	idx_t result_count;
	while (this->count > 0) {
		// if we have saved the match result, we need not call ScanInnerJoin again
		if (last_match_count == 0) {
			result_count = ScanInnerJoin(keys, chain_match_sel_vector);
		} else {
			chain_match_sel_vector.Initialize(last_sel_vector);
			result_count = last_match_count;
			last_match_count = 0;
		}

		if (result_count > 0) {
			// the result chunk cannot contain more data, we record the match result for future use
			if (base_count + result_count > STANDARD_VECTOR_SIZE) {
				last_sel_vector.Initialize(chain_match_sel_vector);
				last_match_count = result_count;
				break;
			}

			if (PropagatesBuildSide(ht.join_type)) {
				// full/right outer join: mark join matches as FOUND in the HT
				auto ptrs = FlatVector::GetData<data_ptr_t>(pointers);
				for (idx_t i = 0; i < result_count; i++) {
					auto idx = chain_match_sel_vector.get_index(i);
					// NOTE: threadsan reports this as a data race because this can be set concurrently by separate
					// threads Technically it is, but it does not matter, since the only value that can be written is
					// "true"
					Store<bool>(true, ptrs[idx] + ht.tuple_size);
				}
			}

			if (ht.join_type != JoinType::RIGHT_SEMI && ht.join_type != JoinType::RIGHT_ANTI) {
				// Fast Path: if there is NO more than one element in the chain, we construct the result chunk directly
				if (!ht.chains_longer_than_one) {
					// matches were found
					// on the LHS, we create a slice using the result vector
					result.Slice(left, chain_match_sel_vector, result_count);

					// on the RHS, we need to fetch the data from the hash table
					for (idx_t i = 0; i < ht.output_columns.size(); i++) {
						auto &vector = result.data[left.ColumnCount() + i];
						const auto output_col_idx = ht.output_columns[i];
						D_ASSERT(vector.GetType() == ht.layout_ptr->GetTypes()[output_col_idx]);
						GatherResult(vector, chain_match_sel_vector, result_count, output_col_idx);
					}

					AdvancePointers();
					return;
				}

				// Common Path: use a buffer to store temporary data
				UpdateCompactionBuffer(base_count, chain_match_sel_vector, result_count);
				base_count += result_count;
			}
		}
		AdvancePointers();
	}

	if (base_count > 0) {
		// create result chunk, we have two steps:
		// 1) slice LHS vectors
		result.Slice(left, lhs_sel_vector, base_count);

		// 2) gather RHS vectors
		for (idx_t i = 0; i < ht.output_columns.size(); i++) {
			auto &vector = result.data[left.ColumnCount() + i];
			const auto output_col_idx = ht.output_columns[i];
			D_ASSERT(vector.GetType() == ht.layout_ptr->GetTypes()[output_col_idx]);
			GatherResult(vector, base_count, output_col_idx);
		}
	}
}